

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setSliceAttributes(SlicePlane *this,ShaderProgram *p)

{
  pointer paVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  VolumeMesh *pVVar3;
  size_t iC;
  size_type sVar4;
  long lVar5;
  array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *paVar6;
  long lVar7;
  size_type __new_size;
  undefined1 *indices;
  allocator local_111;
  undefined1 local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&this->inspectedMeshName);
  pVVar3 = getVolumeMesh(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __new_size = (long)(pVVar3->cells).
                     super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pVVar3->cells).
                     super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x18) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->sliceBufferDataArr)._M_elems[0].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5),__new_size);
  }
  lVar5 = 0;
  for (sVar4 = 0; sVar4 != __new_size; sVar4 = sVar4 + 1) {
    paVar1 = (pVVar3->cells).
             super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar6 = &this->sliceBufferDataArr;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      pvVar2 = paVar6->_M_elems;
      paVar6 = (array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
               (paVar6->_M_elems + 1);
      (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar4] =
           *(uint *)((long)paVar1->_M_elems + lVar7 * 4 + lVar5);
    }
    lVar5 = lVar5 + 0x20;
  }
  for (lVar5 = 0; lVar5 != 0x3a0; lVar5 = lVar5 + 0xe8) {
    render::ManagedBuffer<unsigned_int>::markHostBufferUpdated
              ((ManagedBuffer<unsigned_int> *)
               (&((array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *)
                 (&this->sliceBufferDataArr + 1))->field_0x0 + lVar5));
  }
  std::__cxx11::string::string(local_70,"a_slice_1",&local_111);
  indices = &(pVVar3->super_QuantityStructure<polyscope::VolumeMesh>).field_0x428;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_e0,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_70,local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_90,"a_slice_2",&local_111);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_f0,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_90,local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::string(local_b0,"a_slice_3",&local_111);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_100,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_b0,local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::string((string *)(local_e0 + 0x10),"a_slice_4",&local_111);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_110,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_e0 + 0x10,local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
  std::__cxx11::string::~string((string *)(local_e0 + 0x10));
  return;
}

Assistant:

void SlicePlane::setSliceAttributes(render::ShaderProgram& p) {
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);


  size_t cellCount = meshToInspect->nCells();
  for (int i = 0; i < 4; i++) {
    sliceBufferDataArr[i].resize(cellCount);
  }
  for (size_t iC = 0; iC < cellCount; iC++) {
    const std::array<uint32_t, 8>& cell = meshToInspect->cells[iC];
    for (int i = 0; i < 4; i++) {
      sliceBufferDataArr[i][iC] = cell[i];
    }
  }

  for (int i = 0; i < 4; i++) {
    sliceBufferArr[i].markHostBufferUpdated();
  }

  p.setAttribute("a_slice_1", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[0]));
  p.setAttribute("a_slice_2", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[1]));
  p.setAttribute("a_slice_3", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[2]));
  p.setAttribute("a_slice_4", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[3]));
}